

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_iq1_m(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  ushort *puVar1;
  char cVar2;
  uint64_t *grid;
  ggml_fp16_t gVar3;
  int i;
  uint uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  float *pfVar10;
  float *pfVar11;
  bool bVar12;
  float *pfVar13;
  float *pfVar14;
  byte bVar15;
  int j_5;
  float *pfVar16;
  float *pfVar17;
  ulong uVar18;
  ulong uVar19;
  float *pfVar20;
  int j_2;
  ulong uVar21;
  int j_1;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int k_1;
  undefined *puVar25;
  float *pfVar26;
  float *pfVar27;
  int i_1;
  long lVar28;
  char *pcVar29;
  int iVar30;
  long lVar31;
  float fVar32;
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  ulong uStackY_280;
  int in_stack_fffffffffffffd88;
  uint16_t index [2];
  float *local_248;
  undefined1 local_238 [16];
  int8_t L [16];
  void *local_1f0;
  float local_1b8 [4];
  float local_1a8 [6];
  long local_190;
  int64_t local_188;
  long local_180;
  long local_178;
  int64_t local_170;
  long local_168;
  long local_160;
  uint16_t *local_158;
  int *local_150;
  float weight [16];
  int8_t shifts [16];
  float pairs [32];
  float scales [16];
  
  if ((char)n_per_row == '\0') {
    local_190 = n_per_row >> 8;
    lVar31 = 0;
    local_160 = 0;
    if (0 < local_190) {
      local_160 = local_190;
    }
    local_180 = local_190 * 0x38;
    local_188 = nrow;
    local_170 = 0;
    if (0 < nrow) {
      local_170 = nrow;
    }
    local_178 = n_per_row << 2;
    local_248 = src;
    local_1f0 = dst;
    while( true ) {
      grid = iq2_data[2].grid;
      if (lVar31 == local_170) {
        return local_188 * local_190 * 0x38;
      }
      if (iq2_data[2].grid == (uint64_t *)0x0) break;
      local_150 = iq2_data[2].map;
      if (iq2_data[2].map == (int *)0x0) {
        pcVar29 = "kmap_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar30 = 0x10d6;
        goto LAB_0013ba66;
      }
      if (iq2_data[2].neighbours == (uint16_t *)0x0) {
        pcVar29 = "kneighbors_q2xs && \"forgot to call ggml_quantize_init()?\"";
        iVar30 = 0x10d7;
        goto LAB_0013ba66;
      }
      local_168 = lVar31;
      local_158 = iq2_data[2].neighbours + -1;
      pfVar13 = quant_weights;
      pfVar26 = local_248;
      for (lVar31 = 0; lVar31 != local_160; lVar31 = lVar31 + 1) {
        lVar5 = lVar31 * 0x38;
        *(undefined1 (*) [16])((long)local_1f0 + lVar5 + 0x20) = (undefined1  [16])0x0;
        *(undefined8 *)((long)local_1f0 + lVar5 + 0x30) = 0;
        *(undefined1 (*) [16])((long)local_1f0 + lVar5 + 0x10) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])((long)local_1f0 + lVar5) = (undefined1  [16])0x0;
        fVar34 = 0.0;
        for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
          fVar34 = fVar34 + pfVar26[lVar6] * pfVar26[lVar6];
        }
        fVar34 = (fVar34 + fVar34) * 0.00390625;
        auVar37 = ZEXT416(0);
        lVar6 = 0;
        pfVar16 = pfVar13;
        pfVar27 = pfVar26;
        while( true ) {
          fVar35 = auVar37._0_4_;
          if (lVar6 == 0x10) break;
          if (quant_weights == (float *)0x0) {
            for (lVar28 = 0; lVar28 != 0x10; lVar28 = lVar28 + 1) {
              weight[lVar28] = pfVar27[lVar28] * pfVar27[lVar28];
            }
          }
          else {
            for (lVar28 = 0; lVar28 != 0x10; lVar28 = lVar28 + 1) {
              fVar36 = pfVar16[lVar28];
              fVar32 = pfVar27[lVar28] * pfVar27[lVar28] + fVar34;
              if (fVar32 < 0.0) {
                fVar32 = sqrtf(fVar32);
              }
              else {
                fVar32 = SQRT(fVar32);
              }
              weight[lVar28] = fVar36 * fVar32;
            }
          }
          pfVar17 = local_248 + lVar31 * 0x100 + lVar6 * 0x10;
          fVar36 = ABS(*pfVar17);
          for (lVar28 = 1; lVar28 != 0x10; lVar28 = lVar28 + 1) {
            if (fVar36 <= ABS(pfVar27[lVar28])) {
              fVar36 = ABS(pfVar27[lVar28]);
            }
          }
          if (1e-07 <= fVar36) {
            for (lVar28 = 0; lVar28 != 0x10; lVar28 = lVar28 + 1) {
              pairs[lVar28 * 2] = pfVar27[lVar28];
              pairs[lVar28 * 2 + 1] = (float)lVar28;
            }
            local_238 = ZEXT416((uint)fVar36);
            qsort(pairs,0x10,8,iq1_sort_helper);
            pfVar10 = pairs + 1;
            lVar28 = 0;
            uStackY_280 = 0xffffffffffffffff;
            uVar9 = 0xffffffff;
            uVar8 = 0xffffffff;
            fVar36 = -1.1754944e-38;
            for (uVar18 = 0; uVar19 = uVar18, uVar18 != 0x11; uVar18 = uVar18 + 1) {
              while( true ) {
                uVar21 = uVar19;
                if (uVar19 < uVar18) {
                  uVar21 = uVar18;
                }
                if (uVar19 == 0x11) break;
                local_1a8[1] = 0.0;
                local_1a8[2] = 0.0;
                local_1b8[1] = 0.0;
                local_1b8[3] = 0.0;
                local_1a8[3] = 0.0;
                local_1b8[2] = 0.0;
                auVar38 = ZEXT816(0);
                for (uVar22 = 0; uVar18 != uVar22; uVar22 = uVar22 + 1) {
                  lVar23 = (long)(int)pairs[uVar22 * 2 + 1];
                  fVar32 = auVar38._4_4_;
                  fVar39 = auVar38._8_4_;
                  fVar44 = auVar38._12_4_;
                  if (lVar23 < 8) {
                    fVar43 = pfVar17[lVar23];
                    fVar40 = weight[lVar23] * -0.875;
                    fVar41 = weight[lVar23] * -1.125;
                    fVar45 = fVar41 * fVar43;
                    auVar38._0_4_ = auVar38._0_4_ + fVar40 * -0.875;
                    auVar38._4_4_ = fVar32 + fVar43 * fVar40;
                    auVar38._8_4_ = fVar39 + fVar40 * 0.0;
                    auVar38._12_4_ = fVar44 + fVar40 * 0.0;
                    fVar32 = fVar40 * -0.875;
                    fVar42 = fVar41 * -1.125;
                    fVar40 = fVar43 * fVar40;
                    fVar43 = fVar43 * fVar41;
                  }
                  else {
                    fVar43 = pfVar17[lVar23];
                    fVar41 = weight[lVar23] * -1.125;
                    fVar42 = weight[lVar23] * -0.875;
                    fVar45 = fVar42 * fVar43;
                    auVar38._0_4_ = auVar38._0_4_ + fVar42 * -0.875;
                    auVar38._4_4_ = fVar32 + fVar43 * fVar42;
                    auVar38._8_4_ = fVar39 + fVar42 * 0.0;
                    auVar38._12_4_ = fVar44 + fVar42 * 0.0;
                    fVar32 = fVar41 * -1.125;
                    fVar42 = fVar42 * -0.875;
                    fVar40 = fVar41 * fVar43;
                    fVar43 = fVar41 * fVar43;
                  }
                  local_1a8[2] = local_1a8[2] + fVar42;
                  local_1a8[1] = local_1a8[1] + fVar32;
                  local_1b8[3] = local_1b8[3] + fVar43;
                  local_1b8[1] = local_1b8[1] + fVar40;
                  local_1b8[2] = local_1b8[2] + fVar45;
                  local_1a8[3] = local_1a8[3] + fVar41 * -1.125;
                }
                for (lVar23 = 0; uVar22 = uVar19, uVar21 + lVar28 != lVar23; lVar23 = lVar23 + 1) {
                  lVar24 = (long)(int)pfVar10[lVar23 * 2];
                  fVar32 = auVar38._4_4_;
                  fVar39 = auVar38._8_4_;
                  fVar44 = auVar38._12_4_;
                  if (lVar24 < 8) {
                    fVar43 = pfVar17[lVar24];
                    fVar40 = weight[lVar24] * 0.125;
                    fVar41 = weight[lVar24] * -0.125;
                    fVar45 = fVar41 * fVar43;
                    auVar38._0_4_ = auVar38._0_4_ + fVar40 * 0.125;
                    auVar38._4_4_ = fVar32 + fVar43 * fVar40;
                    auVar38._8_4_ = fVar39 + fVar40 * 0.0;
                    auVar38._12_4_ = fVar44 + fVar40 * 0.0;
                    fVar32 = fVar40 * 0.125;
                    fVar42 = fVar41 * -0.125;
                    fVar40 = fVar43 * fVar40;
                    fVar43 = fVar43 * fVar41;
                  }
                  else {
                    fVar43 = pfVar17[lVar24];
                    fVar41 = weight[lVar24] * -0.125;
                    fVar42 = weight[lVar24] * 0.125;
                    fVar45 = fVar42 * fVar43;
                    auVar38._0_4_ = auVar38._0_4_ + fVar42 * 0.125;
                    auVar38._4_4_ = fVar32 + fVar43 * fVar42;
                    auVar38._8_4_ = fVar39 + fVar42 * 0.0;
                    auVar38._12_4_ = fVar44 + fVar42 * 0.0;
                    fVar32 = fVar41 * -0.125;
                    fVar42 = fVar42 * 0.125;
                    fVar40 = fVar41 * fVar43;
                    fVar43 = fVar41 * fVar43;
                  }
                  local_1a8[2] = local_1a8[2] + fVar42;
                  local_1a8[1] = local_1a8[1] + fVar32;
                  local_1b8[3] = local_1b8[3] + fVar43;
                  local_1b8[1] = local_1b8[1] + fVar40;
                  local_1b8[2] = local_1b8[2] + fVar45;
                  local_1a8[3] = local_1a8[3] + fVar41 * -0.125;
                }
                while( true ) {
                  local_1a8[0] = auVar38._0_4_;
                  local_1b8[0] = auVar38._4_4_;
                  fVar32 = auVar38._8_4_;
                  fVar39 = auVar38._12_4_;
                  if (0xf < uVar22) break;
                  lVar23 = (long)(int)pairs[uVar22 * 2 + 1];
                  if (lVar23 < 8) {
                    fVar44 = pfVar17[lVar23];
                    fVar45 = weight[lVar23] * 1.125;
                    fVar42 = weight[lVar23] * 0.875;
                    fVar43 = fVar42 * fVar44;
                    auVar38._0_4_ = local_1a8[0] + fVar45 * 1.125;
                    auVar38._4_4_ = local_1b8[0] + fVar44 * fVar45;
                    auVar38._8_4_ = fVar32 + fVar45 * 0.0;
                    auVar38._12_4_ = fVar39 + fVar45 * 0.0;
                    fVar32 = fVar45 * 1.125;
                    fVar40 = fVar42 * 0.875;
                    fVar45 = fVar44 * fVar45;
                    fVar44 = fVar44 * fVar42;
                  }
                  else {
                    fVar44 = pfVar17[lVar23];
                    fVar42 = weight[lVar23] * 0.875;
                    fVar40 = weight[lVar23] * 1.125;
                    fVar43 = fVar40 * fVar44;
                    auVar38._0_4_ = local_1a8[0] + fVar40 * 1.125;
                    auVar38._4_4_ = local_1b8[0] + fVar44 * fVar40;
                    auVar38._8_4_ = fVar32 + fVar40 * 0.0;
                    auVar38._12_4_ = fVar39 + fVar40 * 0.0;
                    fVar32 = fVar42 * 0.875;
                    fVar40 = fVar40 * 1.125;
                    fVar45 = fVar42 * fVar44;
                    fVar44 = fVar42 * fVar44;
                  }
                  local_1a8[2] = local_1a8[2] + fVar40;
                  local_1a8[1] = local_1a8[1] + fVar32;
                  local_1b8[3] = local_1b8[3] + fVar44;
                  local_1b8[1] = local_1b8[1] + fVar45;
                  local_1b8[2] = local_1b8[2] + fVar43;
                  local_1a8[3] = local_1a8[3] + fVar42 * 0.875;
                  uVar22 = uVar22 + 1;
                }
                for (uVar21 = 0; uVar21 != 4; uVar21 = uVar21 + 1) {
                  fVar32 = local_1a8[uVar21];
                  if ((0.0 < fVar32) &&
                     (fVar39 = local_1b8[uVar21], fVar36 * fVar32 < fVar39 * fVar39)) {
                    local_238 = ZEXT416((uint)(fVar39 / fVar32));
                    fVar36 = fVar39 * (fVar39 / fVar32);
                    uVar9 = uVar18 & 0xffffffff;
                    uVar8 = uVar19 & 0xffffffff;
                    uStackY_280 = uVar21 & 0xffffffff;
                  }
                }
                uVar19 = uVar19 + 1;
              }
              lVar28 = lVar28 + -1;
              pfVar10 = pfVar10 + 2;
            }
            if ((((int)uVar9 < 0) || ((int)uVar8 < 0)) || (iVar30 = (int)uStackY_280, iVar30 < 0)) {
              pcVar29 = "besti1 >= 0 && besti2 >= 0 && best_k >= 0";
              iVar30 = 0x1165;
              goto LAB_0013ba66;
            }
            for (uVar18 = 0; uVar9 != uVar18; uVar18 = uVar18 + 1) {
              L[(int)pairs[uVar18 * 2 + 1]] = '\0';
            }
            pfVar10 = pairs + uVar9 * 2 + 1;
            for (; (int)uVar9 < (int)uVar8; uVar9 = (ulong)((int)uVar9 + 1)) {
              L[(int)*pfVar10] = '\x01';
              pfVar10 = pfVar10 + 2;
            }
            pfVar10 = pairs + uVar8 * 2 + 1;
            for (; (int)uVar8 < 0x10; uVar8 = (ulong)((int)uVar8 + 1)) {
              L[(int)*pfVar10] = '\x02';
              pfVar10 = pfVar10 + 2;
            }
            auVar33 = local_238;
            if (local_238._0_4_ < 0.0) {
              for (lVar28 = 0; lVar28 != 0x10; lVar28 = lVar28 + 1) {
                L[lVar28] = '\x02' - L[lVar28];
              }
              auVar33._0_8_ = local_238._0_8_ ^ 0x8000000080000000;
              auVar33._8_4_ = local_238._8_4_ ^ 0x80000000;
              auVar33._12_4_ = local_238._12_4_ ^ 0x80000000;
              if (iVar30 == 0) {
                uStackY_280 = 3;
              }
              else if (iVar30 == 1) {
                uStackY_280 = 2;
              }
              else {
                uStackY_280 = (ulong)(iVar30 == 2);
              }
            }
            fVar36 = auVar33._0_4_;
            pfVar10 = (float *)&DAT_0015a06c;
            pfVar14 = (float *)&DAT_0015a06c;
            if ((uStackY_280 & 1) == 0) {
              pfVar14 = (float *)&DAT_0015a060;
            }
            if ((int)uStackY_280 < 2) {
              pfVar10 = (float *)&DAT_0015a060;
            }
            bVar12 = true;
            pcVar29 = L;
            for (lVar28 = 0; lVar28 != 2; lVar28 = lVar28 + 1) {
              uVar8 = 0;
              pcVar7 = pcVar29;
              for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 2) {
                uVar8 = (ulong)((uint)uVar8 | (int)*pcVar7 << ((byte)lVar23 & 0x1f));
                pcVar7 = pcVar7 + 1;
              }
              uVar8 = (ulong)local_150[uVar8 & 0xffff];
              if ((long)uVar8 < 0) {
                pfVar11 = pfVar14;
                if (lVar28 == 0) {
                  pfVar11 = pfVar10;
                }
                uVar4 = iq1_find_best_neighbour2
                                  (local_158 + -uVar8,grid,pfVar17 + lVar28 * 8,weight + lVar28 * 8,
                                   fVar36,pfVar11,L + lVar28 * 8,in_stack_fffffffffffffd88);
                uVar8 = (ulong)uVar4;
                bVar12 = false;
              }
              index[lVar28] = (uint16_t)uVar8;
              pcVar29 = pcVar29 + 8;
            }
            if (!bVar12) {
              fVar32 = 0.0;
              fVar39 = 0.0;
              pfVar17 = weight;
              pfVar11 = pfVar27;
              for (lVar28 = 0; lVar28 != 2; lVar28 = lVar28 + 1) {
                pfVar20 = pfVar14;
                if (lVar28 == 0) {
                  pfVar20 = pfVar10;
                }
                for (lVar23 = 0; lVar23 != 8; lVar23 = lVar23 + 1) {
                  fVar44 = pfVar17[lVar23] *
                           pfVar20[(short)(*(char *)((long)grid + lVar23 + (ulong)index[lVar28] * 8)
                                          + -1) / 2];
                  fVar32 = fVar32 + pfVar11[lVar23] * fVar44;
                  fVar39 = fVar39 + pfVar20[(short)(*(char *)((long)grid +
                                                             lVar23 + (ulong)index[lVar28] * 8) + -1
                                                   ) / 2] * fVar44;
                }
                pfVar17 = pfVar17 + 8;
                pfVar11 = pfVar11 + 8;
              }
              if (0.0 < fVar32 && 0.0 < fVar39) {
                fVar36 = fVar32 / fVar39;
              }
            }
            *(char *)((long)local_1f0 + lVar6 * 2 + lVar5) = (char)index[0];
            *(char *)((long)local_1f0 + lVar6 * 2 + lVar5 + 1) = (char)index[1];
            *(byte *)((long)local_1f0 + lVar6 + lVar5 + 0x20) =
                 (byte)(index[1] >> 4) & 0xf0 | (byte)(index[0] >> 8);
            if (fVar36 < 0.0) {
              pcVar29 = "scale >= 0";
              iVar30 = 0x118f;
              goto LAB_0013ba66;
            }
            scales[lVar6] = fVar36;
            shifts[lVar6] = (int8_t)uStackY_280;
            if (fVar35 <= fVar36) {
              auVar37._0_4_ = fVar36;
            }
          }
          else {
            scales[lVar6] = 0.0;
            L[0] = DAT_0014f580;
            L[1] = UNK_0014f581;
            L[2] = UNK_0014f582;
            L[3] = UNK_0014f583;
            L[4] = UNK_0014f584;
            L[5] = UNK_0014f585;
            L[6] = UNK_0014f586;
            L[7] = UNK_0014f587;
            L[8] = UNK_0014f588;
            L[9] = UNK_0014f589;
            L[10] = UNK_0014f58a;
            L[0xb] = UNK_0014f58b;
            L[0xc] = UNK_0014f58c;
            L[0xd] = UNK_0014f58d;
            L[0xe] = UNK_0014f58e;
            L[0xf] = UNK_0014f58f;
          }
          lVar6 = lVar6 + 1;
          pfVar27 = pfVar27 + 0x10;
          pfVar16 = pfVar16 + 0x10;
        }
        if ((fVar35 != 0.0) || (NAN(fVar35))) {
          fVar36 = 0.0;
          fVar32 = 0.0;
          pfVar16 = pfVar26;
          pfVar27 = pfVar13;
          for (uVar8 = 0; uVar8 != 0x10; uVar8 = uVar8 + 1) {
            uVar4 = (uint)((scales[uVar8] * (1.0 / (fVar35 / 15.0)) + -1.0) * 0.5 + 12582912.0) &
                    0x7fffff;
            if (0x400006 < uVar4) {
              uVar4 = 0x400007;
            }
            if (uVar4 < 0x400001) {
              uVar4 = 0x400000;
            }
            puVar1 = (ushort *)((long)local_1f0 + (uVar8 >> 2 & 0x3fffffff) * 2 + lVar5 + 0x30);
            *puVar1 = *puVar1 | (ushort)(uVar4 << ((byte)uVar8 & 3) * '\x03');
            cVar2 = shifts[uVar8];
            bVar15 = *(byte *)((long)local_1f0 + uVar8 + lVar5 + 0x20) | (&DAT_0014f6e8)[cVar2];
            *(byte *)((long)local_1f0 + uVar8 + lVar5 + 0x20) = bVar15;
            if (quant_weights == (float *)0x0) {
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                weight[lVar6] = pfVar16[lVar6] * pfVar16[lVar6];
              }
            }
            else {
              for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
                fVar39 = pfVar27[lVar6];
                fVar44 = pfVar16[lVar6] * pfVar16[lVar6] + fVar34;
                if (fVar44 < 0.0) {
                  fVar44 = sqrtf(fVar44);
                }
                else {
                  fVar44 = SQRT(fVar44);
                }
                weight[lVar6] = fVar39 * fVar44;
              }
            }
            pfVar17 = weight;
            pfVar10 = pfVar16;
            for (lVar6 = 0;
                (bVar12 = cVar2 < '\x02', lVar6 == 0 ||
                (bVar12 = ((long)cVar2 & 1U) == 0, lVar6 != 2)); lVar6 = lVar6 + 1) {
              puVar25 = &DAT_0015a06c;
              if (bVar12) {
                puVar25 = &DAT_0015a060;
              }
              for (lVar28 = 0; lVar28 != 8; lVar28 = lVar28 + 1) {
                fVar39 = *(float *)(puVar25 +
                                   (long)((short)(*(char *)((long)grid +
                                                           lVar28 + (ulong)((uint)bVar15 <<
                                                                            ((char)lVar6 * -4 + 8U &
                                                                            0x1f) & 0x700) * 8 +
                                                                    (ulong)*(byte *)((long)local_1f0
                                                                                    + lVar6 + uVar8 
                                                  * 2 + lVar5) * 8) + -1) / 2) * 4) *
                         (float)(int)(uVar4 * 2 + -0x7fffff);
                fVar44 = pfVar17[lVar28] * fVar39;
                fVar36 = fVar36 + pfVar10[lVar28] * fVar44;
                fVar32 = fVar32 + fVar39 * fVar44;
              }
              pfVar17 = pfVar17 + 8;
              pfVar10 = pfVar10 + 8;
            }
            pfVar16 = pfVar16 + 0x10;
            pfVar27 = pfVar27 + 0x10;
          }
          gVar3 = ggml_compute_fp32_to_fp16
                            ((float)(~-(uint)(0.0 < fVar32) & (uint)(fVar35 / 15.0) |
                                    (uint)(fVar36 / fVar32) & -(uint)(0.0 < fVar32)) * 1.1125);
          *(uint *)((long)local_1f0 + lVar5 + 0x30) =
               (gVar3 & 0xf) << 0xc | (uint)(ushort)((gVar3 & 0xf0) << 8) << 0x10 |
               *(uint *)((long)local_1f0 + lVar5 + 0x30);
          *(uint *)((long)local_1f0 + lVar5 + 0x34) =
               *(uint *)((long)local_1f0 + lVar5 + 0x34) |
               ((gVar3 & 0xf0000fff) << 4 | (uint)gVar3 << 0x10) & (uint)DAT_0014f620;
        }
        pfVar26 = pfVar26 + 0x100;
        pfVar13 = pfVar13 + 0x100;
      }
      local_248 = (float *)((long)local_248 + local_178);
      local_1f0 = (void *)((long)local_1f0 + local_180);
      lVar31 = local_168 + 1;
    }
    pcVar29 = "kgrid_q2xs && \"forgot to call ggml_quantize_init()?\"";
    iVar30 = 0x10d5;
  }
  else {
    pcVar29 = "n_per_row%QK_K == 0";
    iVar30 = 0x11bf;
  }
LAB_0013ba66:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-quants.c",
             iVar30,"GGML_ASSERT(%s) failed",pcVar29);
}

Assistant:

size_t quantize_iq1_m(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    GGML_ASSERT(n_per_row%QK_K == 0);
    float  scales[QK_K/IQ1M_BLOCK_SIZE];
    float  weight[IQ1M_BLOCK_SIZE];
    int8_t L[IQ1M_BLOCK_SIZE];
    float  pairs[2*IQ1M_BLOCK_SIZE];
    uint16_t index[IQ1M_BLOCK_SIZE/8];
    int8_t shifts[QK_K/IQ1M_BLOCK_SIZE];
    int64_t nblock = n_per_row/QK_K;
    char * qrow = (char *)dst;
    for (int64_t row = 0; row < nrow; ++row) {
        quantize_row_iq1_m_impl(src, qrow, n_per_row, quant_weights, scales, weight, pairs, L, index, shifts);
        src += n_per_row;
        qrow += nblock*sizeof(block_iq1_m);
    }
    return nrow * nblock * sizeof(block_iq1_m);
}